

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::Clamp(Bignum *this)

{
  uint *puVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = this->used_digits_;
  if (0 < (long)iVar2) {
    puVar1 = (this->bigits_).start_;
    uVar3 = (long)iVar2 + 1;
    do {
      iVar2 = iVar2 + -1;
      if (puVar1[uVar3 - 2] != 0) {
        return;
      }
      this->used_digits_ = iVar2;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  if (iVar2 != 0) {
    return;
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}